

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O2

void __thiscall nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages(InternalMsg *this)

{
  uint8_t *__ptr;
  size_t sVar1;
  size_t j;
  ulong uVar2;
  anon_class_8_1_8991fb9c local_38;
  
  for (uVar2 = 0; (uVar2 < 4 && (uVar2 < this->pageCnt)); uVar2 = uVar2 + 1) {
    free((this->firstHeader).firstPages[uVar2].ptr);
  }
  sVar1 = this->pageCnt - uVar2;
  this->pageCnt = sVar1;
  if (sVar1 != 0) {
    local_38.this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages()::_lambda()_1_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0xa0,&local_38,"firstHeader.next() != nullptr");
    while ((this->firstHeader).super_IndexPageHeader.next_.ptr != (uint8_t *)0x0) {
      local_38.this = this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages()::_lambda()_2_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0xa3,&local_38,
                 "pageCnt > localStorageSize || firstHeader.next()->next() == nullptr");
      local_38.this = this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages()::_lambda()_3_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0xa4,&local_38,"firstHeader.next()->usedCnt <= pageCnt");
      uVar2 = 0;
      while( true ) {
        __ptr = (this->firstHeader).super_IndexPageHeader.next_.ptr;
        if (*(ulong *)(__ptr + 8) <= uVar2) break;
        free(*(void **)(__ptr + (uVar2 + 2) * 8));
        uVar2 = uVar2 + 1;
      }
      this->pageCnt = this->pageCnt - *(ulong *)(__ptr + 8);
      (this->firstHeader).super_IndexPageHeader.next_.ptr = *(uint8_t **)__ptr;
      free(__ptr);
    }
  }
  return;
}

Assistant:

void implReleaseAllPages()
		{
			size_t i;
			for ( i=0; i<localStorageSize && i<pageCnt; ++i )
				implReleasePageWrapper( firstHeader.firstPages[i] );
			pageCnt -= i;
			if ( pageCnt )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next() != nullptr );
				while ( firstHeader.next() != nullptr )
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, pageCnt > localStorageSize || firstHeader.next()->next() == nullptr );
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next()->usedCnt <= pageCnt );
					for ( size_t j=0; j<firstHeader.next()->usedCnt; ++j )
						implReleasePageWrapper( firstHeader.next()->pages()[j] );
					pageCnt -= firstHeader.next()->usedCnt;
					PagePointer page = firstHeader.next_;
					firstHeader.next_ = firstHeader.next()->next_;
					implReleasePageWrapper( page );
				}
			}
		}